

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

int hydro_compare(uint8_t *b1_,uint8_t *b2_,size_t len)

{
  size_t i;
  uint8_t eq;
  uint8_t gt;
  uint8_t *b2;
  uint8_t *b1;
  size_t len_local;
  uint8_t *b2__local;
  uint8_t *b1__local;
  
  gt = '\0';
  eq = '\x01';
  i = len;
  while (i != 0) {
    i = i - 1;
    gt = gt | (byte)((uint)b2_[i] - (uint)b1_[i] >> 8) & eq;
    eq = eq & (byte)((b2_[i] ^ b1_[i]) - 1 >> 8);
  }
  return (uint)gt + (uint)gt + (uint)eq + -1;
}

Assistant:

int
hydro_compare(const uint8_t *b1_, const uint8_t *b2_, size_t len)
{
    const volatile uint8_t *volatile b1 = (const volatile uint8_t *volatile) b1_;
    const uint8_t *b2                   = (const uint8_t *) b2_;
    uint8_t        gt                   = 0U;
    uint8_t        eq                   = 1U;
    size_t         i;

    i = len;
    while (i != 0U) {
        i--;
        gt |= ((b2[i] - b1[i]) >> 8) & eq;
        eq &= ((b2[i] ^ b1[i]) - 1) >> 8;
    }
    return (int) (gt + gt + eq) - 1;
}